

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O2

void __thiscall
ExecutionResult::ExecutionResult
          (ExecutionResult *this,shared_ptr<SchemeProcedure> *func,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args
          )

{
  this->type = TAIL_CALL;
  (this->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  make_unique<TailContext,std::shared_ptr<SchemeProcedure>const&,std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&>
            ((shared_ptr<SchemeProcedure> *)&this->tail_context,
             (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *
             )func);
  return;
}

Assistant:

ExecutionResult(const std::shared_ptr<SchemeProcedure> &func,
                    const std::list<std::shared_ptr<SchemeObject>> &args) :
        type(execution_result_t::TAIL_CALL), value(nullptr), tail_context(std::make_unique<TailContext>(func, args))
    {}